

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall Node::Stat(Node *this,DiskInterface *disk_interface,string *err)

{
  Metrics *this_00;
  int iVar1;
  undefined4 extraout_var;
  Metric *pMVar3;
  ScopedMetric metrics_h_scoped;
  string local_48;
  long lVar2;
  
  if (Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar1 = __cxa_guard_acquire(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar1 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar3 = (Metric *)0x0;
      }
      else {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"node stat","");
        pMVar3 = Metrics::NewMetric(this_00,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      Stat::metrics_h_metric = pMVar3;
      __cxa_guard_release(&Stat(DiskInterface*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&local_48,Stat::metrics_h_metric);
  iVar1 = (*(disk_interface->super_FileReader)._vptr_FileReader[3])(disk_interface,this,err);
  lVar2 = CONCAT44(extraout_var,iVar1);
  this->mtime_ = lVar2;
  if (lVar2 != -1) {
    this->exists_ = ExistenceStatusExists - (lVar2 == 0);
  }
  ScopedMetric::~ScopedMetric((ScopedMetric *)&local_48);
  return lVar2 != -1;
}

Assistant:

bool Node::Stat(DiskInterface* disk_interface, string* err) {
  METRIC_RECORD("node stat");
  mtime_ = disk_interface->Stat(path_, err);
  if (mtime_ == -1) {
    return false;
  }
  exists_ = (mtime_ != 0) ? ExistenceStatusExists : ExistenceStatusMissing;
  return true;
}